

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

DynamicType * __thiscall
Js::JavascriptLibrary::GetCachedCustomExternalWrapperType
          (JavascriptLibrary *this,uintptr_t traceCallback,uintptr_t finalizeCallback,
          uintptr_t interceptors,uintptr_t prototype)

{
  Type *addr;
  bool bVar1;
  Recycler *alloc;
  WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  *pWVar2;
  DynamicType *pDVar3;
  undefined1 local_70 [8];
  TrackAllocData data;
  RecyclerWeakReference<Js::DynamicType> *local_38;
  RecyclerWeakReference<Js::DynamicType> *dynamicTypeWeakRef;
  
  local_38 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
  addr = &this->customExternalWrapperTypesCache;
  if ((this->customExternalWrapperTypesCache).ptr ==
      (WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
       *)0x0) {
    local_70 = (undefined1  [8])
               &JsUtil::
                WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Js::DynamicType,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x132d;
    data._32_8_ = prototype;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
    pWVar2 = (WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
              *)new<Memory::Recycler>(0x40,alloc,0x38bbb2);
    JsUtil::
    BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(&pWVar2->
                      super_BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                     ,this->recycler,3);
    (pWVar2->super_IWeakReferenceDictionary)._vptr_IWeakReferenceDictionary =
         (_func_int **)&PTR_Cleanup_01542c30;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->customExternalWrapperTypesCache).ptr = pWVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    ScriptContext::RegisterWeakReferenceDictionary
              ((this->super_JavascriptLibraryBase).scriptContext.ptr,
               &((this->customExternalWrapperTypesCache).ptr)->super_IWeakReferenceDictionary);
    prototype = data._32_8_;
  }
  local_70 = (undefined1  [8])traceCallback;
  data.typeinfo = (type_info *)finalizeCallback;
  data.plusSize = interceptors;
  data.count = prototype;
  bVar1 = JsUtil::
          BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<Js::JavascriptLibrary::CustomExternalWrapperCallbacks>
                    (&addr->ptr->
                      super_BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                     ,(CustomExternalWrapperCallbacks *)local_70,&local_38);
  if (bVar1) {
    pDVar3 = (DynamicType *)(local_38->super_RecyclerWeakReferenceBase).strongRef;
  }
  else {
    pDVar3 = (DynamicType *)0x0;
  }
  return pDVar3;
}

Assistant:

DynamicType* JavascriptLibrary::GetCachedCustomExternalWrapperType(uintptr_t traceCallback, uintptr_t finalizeCallback, uintptr_t interceptors, uintptr_t prototype)
    {
        RecyclerWeakReference<DynamicType>* dynamicTypeWeakRef = nullptr;
        DynamicType* dynamicType = nullptr;
        if (customExternalWrapperTypesCache == nullptr)
        {
            customExternalWrapperTypesCache = RecyclerNew(recycler, CustomExternalWrapperTypesCache, recycler, 3);
            // Register for periodic cleanup
            scriptContext->RegisterWeakReferenceDictionary(customExternalWrapperTypesCache);
        }
        if (customExternalWrapperTypesCache->TryGetValue(CustomExternalWrapperCallbacks(traceCallback, finalizeCallback, interceptors, prototype), &dynamicTypeWeakRef))
        {
            dynamicType = dynamicTypeWeakRef->Get();
        }
        return dynamicType;
    }